

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void setup_target_rate(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  AV1_COMP *in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  int target_rate;
  GF_GROUP *gf_group;
  RATE_CONTROL *rc;
  
  iVar1 = (in_RDI->ppi->gf_group).bit_allocation[in_RDI->gf_frame_index];
  iVar2 = has_no_stats_stage(in_RDI);
  if (iVar2 != 0) {
    av1_rc_set_frame_target((AV1_COMP *)gf_group,target_rate,in_stack_00000008,unaff_retaddr);
  }
  (in_RDI->rc).base_frame_target = iVar1;
  return;
}

Assistant:

static void setup_target_rate(AV1_COMP *cpi) {
  RATE_CONTROL *const rc = &cpi->rc;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;

  int target_rate = gf_group->bit_allocation[cpi->gf_frame_index];

  if (has_no_stats_stage(cpi)) {
    av1_rc_set_frame_target(cpi, target_rate, cpi->common.width,
                            cpi->common.height);
  }

  rc->base_frame_target = target_rate;
}